

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void backTrace(object *aContext)

{
  object *poVar1;
  object *poVar2;
  ulong uVar3;
  int iVar4;
  object *local_50;
  object *arg;
  int i;
  object *arguments;
  object *symbol;
  object *class;
  object *method;
  object *aContext_local;
  
  printf("back trace\n");
  if ((aContext == (object *)0x0) || (aContext == nilObject)) {
    info_impl("backTrace",0x46,"   Cannot dump context, point is NULL or points to the nil object!")
    ;
  }
  else {
    iVar4 = isDynamicMemory(aContext);
    method = aContext;
    if (iVar4 == 0) {
      info_impl("backTrace",0x3d,"  Cannot dump context, pointer is not to a live object!");
    }
    else {
      for (; method != (object *)0x0 && method != nilObject; method = (object *)method[4].header) {
        poVar1 = (object *)method[1].header;
        if ((poVar1 == (object *)0x0) || (poVar1 == nilObject)) {
          printf(" nil method ");
        }
        else {
          poVar2 = poVar1[3].class;
          if ((poVar2 == (object *)0x0) || (poVar2 == nilObject)) {
            printf("nil class");
          }
          else {
            poVar2 = (object *)poVar2[1].header;
            if ((poVar2 == (object *)0x0) || (poVar2 == nilObject)) {
              printf("nil class name");
            }
            else {
              printf("class %.*s",poVar2->header >> 2 & 0x3fffffff,poVar2 + 1);
            }
          }
          poVar1 = (object *)poVar1[1].header;
          if ((poVar1 == (object *)0x0) || (poVar1 == nilObject)) {
            printf(" nil symbol ");
          }
          else {
            printf(" #%.*s ",poVar1->header >> 2 & 0x3fffffff,poVar1 + 1);
          }
        }
        poVar1 = method[1].class;
        if ((poVar1 != (object *)0x0) && (poVar1 != nilObject)) {
          printf("(");
          for (arg._4_4_ = 0; arg._4_4_ < (int)((uint)(poVar1->header >> 2) & 0x3fffffff);
              arg._4_4_ = arg._4_4_ + 1) {
            if (0 < arg._4_4_) {
              printf(", ");
            }
            if ((&poVar1[1].header)[arg._4_4_] == 0) {
              printf("nil arg");
            }
            else {
              uVar3 = (&poVar1[1].header)[arg._4_4_];
              if ((uVar3 & 1) == 0) {
                if ((uVar3 & 1) == 0) {
                  local_50 = *(object **)(uVar3 + 8);
                }
                else {
                  local_50 = SmallIntClass;
                }
                if ((local_50 == (object *)0x0) || (local_50 == nilObject)) {
                  printf("nil class");
                }
                else {
                  poVar2 = (object *)local_50[1].header;
                  if ((poVar2 == (object *)0x0) || (poVar2 == nilObject)) {
                    printf("nil class name");
                  }
                  else {
                    printf("%.*s",poVar2->header >> 2 & 0x3fffffff,poVar2 + 1);
                  }
                }
              }
              else {
                printf("%d",(long)uVar3 >> 1 & 0xffffffff);
              }
            }
          }
          printf(")");
        }
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void backTrace(struct object * aContext)
{
    printf("back trace\n");

    /* check if we actually got a Context. */
    if(NOT_NIL(aContext)) {
        if(! isDynamicMemory(aContext)) {
            info("  Cannot dump context, pointer is not to a live object!");
            return;

            if(aContext->class != ContextClass) {
                info("  Cannot dump context, pointer is not to a Context object!");
                return;
            }
        }
    } else {
        info("   Cannot dump context, point is NULL or points to the nil object!");
        return;
    }

    while (NOT_NIL(aContext)) {
        struct object *method = aContext->data[methodInContext];
        struct object *class;
        struct object *symbol;
        struct object *arguments;
        int i;

        if(NOT_NIL(method)) {
            class = method->data[classInMethod];

            if(NOT_NIL(class)) {
                symbol = class->data[nameInClass];

                if(NOT_NIL(symbol)) {
                    printf("class %.*s", SIZE(symbol), bytePtr(symbol));
                } else {
                    printf("nil class name");
                }
            } else {
                printf("nil class");
            }

            symbol = method->data[nameInMethod];
            if(NOT_NIL(symbol)) {
                printf(" #%.*s ", SIZE(symbol), bytePtr(symbol));
            } else {
                printf(" nil symbol ");
            }
        } else {
            printf(" nil method ");
        }

        arguments = aContext->data[argumentsInContext];
        if (NOT_NIL(arguments)) {
            printf("(");
            for (i = 0; i < (int)SIZE(arguments); i++) {
                if(i > 0) { printf(", "); }
                if(arguments->data[i]) {
                    struct object *arg = arguments->data[i];

                    if(IS_SMALLINT(arg)) {
                        printf("%d", integerValue(arg));
                    } else {
                        class = CLASS(arg);

                        if(NOT_NIL(class)) {
                            symbol = class->data[nameInClass];

                            if(NOT_NIL(symbol)) {
                                printf("%.*s", SIZE(symbol), bytePtr(symbol));
                            } else {
                                printf("nil class name");
                            }
                        } else {
                            printf("nil class");
                        }
                    }
                } else {
                    printf("nil arg");
                }
            }

            printf(")");
        }
        printf("\n");

        aContext = aContext->data[previousContextInContext];
    }
}